

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySharedMemory.cpp
# Opt level: O1

void __thiscall MySharedMemory::detach(MySharedMemory *this)

{
  sem_close((sem_t *)this->sem);
  munmap(this->addr,this->mapping_size);
  sem_unlink((this->key)._M_dataplus._M_p);
  shm_unlink((this->key)._M_dataplus._M_p);
  return;
}

Assistant:

void MySharedMemory::detach() {
    #ifdef _WIN32
    UnmapViewOfFile(addr);
    #elif __linux__ || __APPLE__
    sem_close(sem);
    munmap(addr, mapping_size);
    sem_unlink(key.c_str());
    shm_unlink(key.c_str());
    #endif
}